

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_or_null_simplification.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::EqualOrNullSimplification::Apply
          (EqualOrNullSimplification *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  _func_int **in_RAX;
  reference pvVar1;
  BoundConjunctionExpression *pBVar2;
  const_reference pvVar3;
  type equal_expr;
  type and_expr;
  pointer *__ptr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> first_try;
  _func_int **local_28;
  
  local_28 = in_RAX;
  pvVar1 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  if (((pvVar1->_M_data->super_BaseExpression).type != CONJUNCTION_OR) ||
     (pBVar2 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                         (&pvVar1->_M_data->super_BaseExpression),
     (long)(pBVar2->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish -
     (long)(pBVar2->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start != 0x10)) {
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](&pBVar2->children,0);
  equal_expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar3);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](&pBVar2->children,1);
  and_expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar3);
  TryRewriteEqualOrIsNull((duckdb *)&local_28,equal_expr,and_expr);
  if (local_28 == (_func_int **)0x0) {
    TryRewriteEqualOrIsNull((duckdb *)this,and_expr,equal_expr);
  }
  else {
    (this->super_Rule)._vptr_Rule = local_28;
    local_28 = (_func_int **)0x0;
  }
  if (local_28 == (_func_int **)0x0) {
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  (**(code **)(*local_28 + 8))();
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> EqualOrNullSimplification::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                        bool &changes_made, bool is_root) {
	const Expression &or_exp = bindings[0].get();

	if (or_exp.GetExpressionType() != ExpressionType::CONJUNCTION_OR) {
		return nullptr;
	}

	const auto &or_exp_cast = or_exp.Cast<BoundConjunctionExpression>();

	if (or_exp_cast.children.size() != 2) {
		return nullptr;
	}

	auto &left_exp = *or_exp_cast.children[0];
	auto &right_exp = *or_exp_cast.children[1];
	// Test for: a=b OR (a IS NULL AND b IS NULL)
	auto first_try = TryRewriteEqualOrIsNull(left_exp, right_exp);
	if (first_try) {
		return first_try;
	}
	// Test for: (a IS NULL AND b IS NULL) OR a=b
	return TryRewriteEqualOrIsNull(right_exp, left_exp);
}